

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall
re2::Regexp::ParseState::ParseCharClass
          (ParseState *this,StringPiece *s,Regexp **out_re,RegexpStatus *status)

{
  char *pcVar1;
  char cVar2;
  ParseFlags parse_flags;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ParseStatus PVar7;
  uint uVar8;
  int iVar9;
  Regexp *this_00;
  CharClassBuilder *pCVar10;
  UGroup *pUVar11;
  char *pcVar12;
  RuneRange rr;
  StringPiece whole_class;
  Rune r;
  StringPiece local_78;
  int local_5c;
  StringPiece local_58;
  StringPiece *local_48;
  Regexp **local_40;
  Rune local_34;
  
  local_58.ptr_ = s->ptr_;
  local_58.length_ = s->length_;
  local_58._12_4_ = *(undefined4 *)&s->field_0xc;
  if ((s->length_ == 0) || (*s->ptr_ != '[')) {
    status->code_ = kRegexpInternalError;
    (status->error_arg_).ptr_ = (char *)0x0;
    (status->error_arg_).length_ = 0;
  }
  else {
    local_40 = out_re;
    this_00 = (Regexp *)operator_new(0x28);
    Regexp(this_00,kRegexpCharClass,this->flags_ & ~FoldCase);
    pCVar10 = (CharClassBuilder *)operator_new(0x40);
    CharClassBuilder::CharClassBuilder(pCVar10);
    (this_00->field_7).field_3.ccb_ = pCVar10;
    pcVar12 = s->ptr_;
    pcVar1 = pcVar12 + 1;
    s->ptr_ = pcVar1;
    iVar9 = s->length_;
    s->length_ = iVar9 + -1;
    if ((iVar9 < 2) || (*pcVar1 != '^')) {
      bVar4 = false;
    }
    else {
      s->ptr_ = pcVar12 + 2;
      s->length_ = iVar9 + -2;
      bVar4 = true;
      if ((this->flags_ & (NeverNL|ClassNL)) != ClassNL) {
        CharClassBuilder::AddRange(pCVar10,10,10);
      }
    }
    uVar8 = s->length_;
    if (0 < (int)uVar8) {
      local_5c = 0x1c;
      local_48 = &status->error_arg_;
      bVar3 = 1;
      do {
        pcVar1 = s->ptr_;
        cVar2 = *pcVar1;
        if ((bool)(~bVar3 & cVar2 == ']')) break;
        if (((!(bool)(bVar3 | cVar2 != '-')) && ((this->flags_ & PerlX) == NoParseFlags)) &&
           ((uVar8 == 1 || (pcVar1[1] != ']')))) {
          local_78.ptr_ = s->ptr_ + 1;
          local_78.length_ = (int)*(undefined8 *)&s->length_;
          local_78._12_4_ = SUB84((ulong)*(undefined8 *)&s->length_ >> 0x20,0);
          local_78.length_ = local_78.length_ + -1;
          iVar9 = StringPieceToRune(&local_34,&local_78,status);
          if (iVar9 < 0) goto LAB_001100da;
          status->code_ = kRegexpBadCharRange;
          iVar9 = iVar9 + 1;
          (status->error_arg_).ptr_ = s->ptr_;
          goto LAB_001100d6;
        }
        if ((cVar2 == '[' && 2 < (int)uVar8) && (pcVar1[1] == ':')) {
          iVar9 = 2;
          if (3 < (int)uVar8) {
            parse_flags = this->flags_;
            pCVar10 = (this_00->field_7).field_3.ccb_;
            pcVar12 = pcVar1 + 2;
            iVar6 = 4;
            bVar5 = false;
            do {
              if ((*pcVar12 == ':') && (pcVar12[1] == ']')) {
                if (!bVar5) {
                  local_78.length_ = iVar6;
                  local_78.ptr_ = pcVar1;
                  pUVar11 = LookupGroup(&local_78,(UGroup *)posix_groups,local_5c);
                  if (pUVar11 == (UGroup *)0x0) {
                    status->code_ = kRegexpBadCharRange;
                    local_48->length_ = local_78.length_;
                    local_48->ptr_ = local_78.ptr_;
                    iVar9 = 1;
                  }
                  else {
                    s->ptr_ = s->ptr_ + local_78.length_;
                    s->length_ = s->length_ - local_78.length_;
                    AddUGroup(pCVar10,pUVar11,pUVar11->sign,parse_flags);
                    iVar9 = 0;
                  }
                }
                break;
              }
              pcVar12 = pcVar12 + 1;
              iVar6 = iVar6 + 1;
              bVar5 = pcVar1 + uVar8 + -2 < pcVar12;
            } while (pcVar12 <= pcVar1 + uVar8 + -2);
          }
          if (iVar9 != 0) {
            if (iVar9 != 1) goto LAB_0010ffc8;
            goto LAB_001100da;
          }
        }
        else {
LAB_0010ffc8:
          if (((2 < s->length_) && (*s->ptr_ == '\\')) && ((byte)(s->ptr_[1] | 0x20U) == 0x70)) {
            PVar7 = ParseUnicodeGroup(s,this->flags_,(this_00->field_7).field_3.ccb_,status);
            if (PVar7 == kParseOk) goto LAB_00110088;
            if (PVar7 == kParseError) goto LAB_001100da;
          }
          pUVar11 = MaybeParsePerlCCEscape(s,this->flags_);
          if (pUVar11 == (UGroup *)0x0) {
            local_78.ptr_ = (char *)0x0;
            bVar5 = ParseCCRange(this,s,(RuneRange *)&local_78,&local_58,status);
            if (bVar5) {
              CharClassBuilder::AddRangeFlags
                        ((this_00->field_7).field_3.ccb_,(Rune)local_78.ptr_,local_78.ptr_._4_4_,
                         this->flags_ | ClassNL);
              bVar5 = false;
            }
            else {
              Decref(this_00);
              bVar5 = true;
            }
          }
          else {
            AddUGroup((this_00->field_7).field_3.ccb_,pUVar11,pUVar11->sign,this->flags_);
            bVar5 = false;
          }
          if (bVar5) {
            return false;
          }
        }
LAB_00110088:
        uVar8 = s->length_;
        bVar3 = 0;
      } while (0 < (int)uVar8);
    }
    if (uVar8 != 0) {
      s->ptr_ = s->ptr_ + 1;
      s->length_ = uVar8 - 1;
      if (bVar4) {
        CharClassBuilder::Negate((this_00->field_7).field_3.ccb_);
      }
      *local_40 = this_00;
      return true;
    }
    status->code_ = kRegexpMissingBracket;
    (status->error_arg_).ptr_ = local_58.ptr_;
    iVar9 = local_58.length_;
LAB_001100d6:
    (status->error_arg_).length_ = iVar9;
LAB_001100da:
    Decref(this_00);
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParseCharClass(StringPiece* s,
                                        Regexp** out_re,
                                        RegexpStatus* status) {
  StringPiece whole_class = *s;
  if (s->size() == 0 || (*s)[0] != '[') {
    // Caller checked this.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(NULL);
    return false;
  }
  bool negated = false;
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  s->remove_prefix(1);  // '['
  if (s->size() > 0 && (*s)[0] == '^') {
    s->remove_prefix(1);  // '^'
    negated = true;
    if (!(flags_ & ClassNL) || (flags_ & NeverNL)) {
      // If NL can't match implicitly, then pretend
      // negated classes include a leading \n.
      re->ccb_->AddRange('\n', '\n');
    }
  }
  bool first = true;  // ] is okay as first char in class
  while (s->size() > 0 && ((*s)[0] != ']' || first)) {
    // - is only okay unescaped as first or last in class.
    // Except that Perl allows - anywhere.
    if ((*s)[0] == '-' && !first && !(flags_&PerlX) &&
        (s->size() == 1 || (*s)[1] != ']')) {
      StringPiece t = *s;
      t.remove_prefix(1);  // '-'
      Rune r;
      int n = StringPieceToRune(&r, &t, status);
      if (n < 0) {
        re->Decref();
        return false;
      }
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(StringPiece(s->data(), 1+n));
      re->Decref();
      return false;
    }
    first = false;

    // Look for [:alnum:] etc.
    if (s->size() > 2 && (*s)[0] == '[' && (*s)[1] == ':') {
      switch (ParseCCName(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Unicode character group like \p{Han}
    if (s->size() > 2 &&
        (*s)[0] == '\\' &&
        ((*s)[1] == 'p' || (*s)[1] == 'P')) {
      switch (ParseUnicodeGroup(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Perl character class symbols (extension).
    const UGroup *g = MaybeParsePerlCCEscape(s, flags_);
    if (g != NULL) {
      AddUGroup(re->ccb_, g, g->sign, flags_);
      continue;
    }

    // Otherwise assume single character or simple range.
    RuneRange rr;
    if (!ParseCCRange(s, &rr, whole_class, status)) {
      re->Decref();
      return false;
    }
    // AddRangeFlags is usually called in response to a class like
    // \p{Foo} or [[:foo:]]; for those, it filters \n out unless
    // Regexp::ClassNL is set.  In an explicit range or singleton
    // like we just parsed, we do not filter \n out, so set ClassNL
    // in the flags.
    re->ccb_->AddRangeFlags(rr.lo, rr.hi, flags_ | Regexp::ClassNL);
  }
  if (s->size() == 0) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    re->Decref();
    return false;
  }
  s->remove_prefix(1);  // ']'

  if (negated)
    re->ccb_->Negate();

  *out_re = re;
  return true;
}